

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread.c
# Opt level: O2

int test_start_n_thread(_func_void_void_ptr *func,TEST_ARGS *args)

{
  int iVar1;
  void *__ptr;
  int *ptr;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = args->num_threads;
  __ptr = malloc(uVar6 << 3);
  ptr = (int *)calloc(1,(long)(int)uVar6 * 0x18);
  uVar2 = 0;
  uVar5 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar5 = uVar2;
  }
  for (; uVar5 * 0x18 - uVar2 != 0; uVar2 = uVar2 + 0x18) {
    *(int64_t *)((long)ptr + uVar2 + 8) = args->N;
  }
  piVar3 = ptr;
  lVar4 = 0;
  do {
    if (uVar5 * 8 + 8 == lVar4 + 8) {
      iVar1 = 1;
      piVar3 = ptr;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pthread_join(*(pthread_t *)((long)__ptr + uVar6 * 8),(void **)0x0);
        if (*piVar3 == 0) {
          iVar1 = 0;
        }
        piVar3 = piVar3 + 6;
      }
      free(__ptr);
      CRYPTO_free(ptr);
      return iVar1;
    }
    iVar1 = pthread_create((pthread_t *)(lVar4 + (long)__ptr),(pthread_attr_t *)0x0,
                           (__start_routine *)func,piVar3);
    piVar3 = piVar3 + 6;
    lVar4 = lVar4 + 8;
  } while (iVar1 == 0);
  return 0;
}

Assistant:

int test_start_n_thread(void (*func)(void *), TEST_ARGS *args)
{
    int i;
    int ret = GML_OK;
    int num_threads = args->num_threads;
    pthread_t *t;

    t = (pthread_t*)malloc(sizeof(pthread_t) * args->num_threads);
    TEST_ARGS *test_args = calloc(1, num_threads*sizeof(TEST_ARGS));

    /* copy arguments */
    for (int i = 0; i < num_threads; i++)
        test_args[i].N = args->N;

    /* start threads */
    for (i = 0; i < num_threads; i++)
        if (pthread_create(&t[i], NULL, (void*)func, (void*)&test_args[i]))
            return GML_ERROR;

    // sleep(5);

    // pthread_mutex_lock(&mut);
    // for(i = 0; i < n; i++)
    // {
    //     pthread_cond_signal(&cond[i]);
    // }
    // pthread_mutex_unlock(&mut);

    for (int i = 0; i < num_threads; i++) {
        pthread_join(t[i], NULL);
        if (test_args[i].ok == GML_ERROR)
            ret = GML_ERROR;
    }

    free(t);
    CRYPTO_free(test_args);
    return ret;
}